

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttp2connection_p.h
# Opt level: O1

bool __thiscall QHttp2Stream::isUploadBlocked(QHttp2Stream *this)

{
  bool bVar1;
  long lVar2;
  
  if (*(long *)(this + 0x38) != 0) {
    bVar1 = true;
    if (10 < *(int *)(this + 0x18)) {
      lVar2 = QMetaObject::cast((QObject *)&QHttp2Connection::staticMetaObject);
      bVar1 = *(int *)(lVar2 + 0x29c) < 0xb;
    }
    return bVar1;
  }
  return false;
}

Assistant:

bool isUploadingDATA() const noexcept { return m_uploadByteDevice != nullptr; }